

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O1

JsErrorCode
JsGetTypedArrayStorage
          (JsValueRef instance,BYTE **buffer,uint *bufferLength,JsTypedArrayType *typedArrayType,
          int *elementSize)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  RecyclableObject *this;
  TypedArrayBase *pTVar5;
  Type typeId;
  JsErrorCode JVar6;
  DebugCheckNoException local_38;
  DebugCheckNoException __debugCheckNoException;
  
  if (instance == (JsValueRef)0x0) {
    return JsErrorInvalidArgument;
  }
  if (bufferLength == (uint *)0x0 || buffer == (BYTE **)0x0) {
    return JsErrorNullArgument;
  }
  local_38.hasException = true;
  local_38.__exceptionCheck = ExceptionCheck::Save();
  if (((ulong)instance & 0x1ffff00000000) != 0x1000000000000 &&
      ((ulong)instance & 0xffff000000000000) == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/../Runtime/Language/TaggedInt.inl"
                       ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                       "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) goto LAB_0037bdeb;
    *puVar4 = 0;
  }
  typeId = TypeIds_FirstNumberType;
  if ((((ulong)instance & 0xffff000000000000) != 0x1000000000000) &&
     (typeId = TypeIds_Number, (ulong)instance >> 0x32 == 0)) {
    this = Js::UnsafeVarTo<Js::RecyclableObject>(instance);
    if (this == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/../Runtime/Language/JavascriptOperators.inl"
                         ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar2) goto LAB_0037bdeb;
      *puVar4 = 0;
    }
    typeId = ((this->type).ptr)->typeId;
    if ((0x57 < (int)typeId) && (BVar3 = Js::RecyclableObject::IsExternal(this), BVar3 == 0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/../Runtime/Language/JavascriptOperators.inl"
                         ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                         "GetTypeId aValue has invalid TypeId");
      if (!bVar2) goto LAB_0037bdeb;
      *puVar4 = 0;
    }
  }
  BVar3 = Js::TypedArrayBase::Is(typeId);
  if (BVar3 == 0) {
    JVar6 = JsErrorInvalidArgument;
LAB_0037bd48:
    local_38.hasException = false;
    bVar2 = false;
  }
  else {
    pTVar5 = Js::VarTo<Js::TypedArrayBase>(instance);
    *buffer = pTVar5->buffer;
    *bufferLength =
         pTVar5->BYTES_PER_ELEMENT * (pTVar5->super_ArrayBufferParent).super_ArrayObject.length;
    if (typedArrayType != (JsTypedArrayType *)0x0) {
      BVar3 = Js::TypedArrayBase::Is(typeId);
      if (BVar3 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/Jsrt.cpp"
                           ,0x8b3,"(Js::TypedArrayBase::Is(typeId))",
                           "Js::TypedArrayBase::Is(typeId)");
        if (!bVar2) goto LAB_0037bdeb;
        *puVar4 = 0;
      }
      *typedArrayType = typeId - 0x2c;
    }
    JVar6 = JsErrorFatal;
    bVar2 = true;
    if (elementSize == (int *)0x0) goto LAB_0037bd65;
    switch(typeId) {
    case TypeIds_Int8Array:
    case TypeIds_Uint8Array:
    case TypeIds_Uint8ClampedArray:
      *elementSize = 1;
      break;
    case TypeIds_Int16Array:
    case TypeIds_Uint16Array:
      *elementSize = 2;
      break;
    case TypeIds_Int32Array:
    case TypeIds_Uint32Array:
    case TypeIds_Float32Array:
      *elementSize = 4;
      break;
    case TypeIds_Float64Array:
      *elementSize = 8;
      break;
    default:
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/Jsrt.cpp"
                         ,0x92f,"(0)","invalid typed array type");
      if (!bVar2) {
LAB_0037bdeb:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
      *elementSize = 1;
      goto LAB_0037bd48;
    }
  }
LAB_0037bd65:
  if (bVar2) {
    local_38.hasException = false;
    JVar6 = JsNoError;
  }
  DebugCheckNoException::~DebugCheckNoException(&local_38);
  return JVar6;
}

Assistant:

END_JSRT_NO_EXCEPTION
}

CHAKRA_API JsGetTypedArrayStorage(_In_ JsValueRef instance, _Outptr_result_bytebuffer_(*bufferLength) BYTE **buffer,
    _Out_ unsigned int *bufferLength, _Out_opt_ JsTypedArrayType *typedArrayType, _Out_opt_ int *elementSize)
{
    VALIDATE_JSREF(instance);
    PARAM_NOT_NULL(buffer);
    PARAM_NOT_NULL(bufferLength);

    BEGIN_JSRT_NO_EXCEPTION
    {
        const Js::TypeId typeId = Js::JavascriptOperators::GetTypeId(instance);
        if (!Js::TypedArrayBase::Is(typeId))
        {
            RETURN_NO_EXCEPTION(JsErrorInvalidArgument);
        }

        Js::TypedArrayBase* typedArrayBase = Js::VarTo<Js::TypedArrayBase>(instance);
        *buffer = typedArrayBase->GetByteBuffer();
        *bufferLength = typedArrayBase->GetByteLength();

        if (typedArrayType)
        {
            *typedArrayType = GetTypedArrayType(typeId);
        }

        if (elementSize)
        {
            switch (typeId)
            {
                case Js::TypeIds_Int8Array:
                    *elementSize = sizeof(int8);
                    break;
                case Js::TypeIds_Uint8Array:
                    *elementSize = sizeof(uint8);
                    break;
                case Js::TypeIds_Uint8ClampedArray:
                    *elementSize = sizeof(uint8);
                    break;
                case Js::TypeIds_Int16Array:
                    *elementSize = sizeof(int16);
                    break;
                case Js::TypeIds_Uint16Array:
                    *elementSize = sizeof(uint16);
                    break;
                case Js::TypeIds_Int32Array:
                    *elementSize = sizeof(int32);
                    break;
                case Js::TypeIds_Uint32Array:
                    *elementSize = sizeof(uint32);
                    break;
                case Js::TypeIds_Float32Array:
                    *elementSize = sizeof(float);
                    break;
                case Js::TypeIds_Float64Array:
                    *elementSize = sizeof(double);
                    break;
                default:
                    AssertMsg(FALSE, "invalid typed array type");
                    *elementSize = 1;
                    RETURN_NO_EXCEPTION(JsErrorFatal);
            }
        }
    }